

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editor.cpp
# Opt level: O0

void __thiscall CLayerGroup::DeleteLayer(CLayerGroup *this,int Index)

{
  CLayer *pCVar1;
  int iVar2;
  CLayer **ppCVar3;
  int in_ESI;
  long *in_RDI;
  undefined4 in_stack_ffffffffffffffe0;
  int iVar4;
  
  if ((-1 < in_ESI) &&
     (iVar4 = in_ESI,
     iVar2 = array<CLayer_*,_allocator_default<CLayer_*>_>::size
                       ((array<CLayer_*,_allocator_default<CLayer_*>_> *)(in_RDI + 1)),
     iVar4 < iVar2)) {
    ppCVar3 = array<CLayer_*,_allocator_default<CLayer_*>_>::operator[]
                        ((array<CLayer_*,_allocator_default<CLayer_*>_> *)(in_RDI + 1),in_ESI);
    pCVar1 = *ppCVar3;
    if (pCVar1 != (CLayer *)0x0) {
      (*pCVar1->_vptr_CLayer[1])();
    }
    array<CLayer_*,_allocator_default<CLayer_*>_>::remove_index
              ((array<CLayer_*,_allocator_default<CLayer_*>_> *)
               CONCAT44(iVar4,in_stack_ffffffffffffffe0),(int)((ulong)pCVar1 >> 0x20));
    *(undefined1 *)(*in_RDI + 8) = 1;
  }
  return;
}

Assistant:

void CLayerGroup::DeleteLayer(int Index)
{
	if(Index < 0 || Index >= m_lLayers.size()) return;
	delete m_lLayers[Index];
	m_lLayers.remove_index(Index);
	m_pMap->m_Modified = true;
}